

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type
pugi::impl::anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf16_writer>
          (uint *param_1,ulong param_2,value_type param_3)

{
  byte bVar1;
  value_type puVar2;
  bool bVar3;
  uint8_t lead;
  uint8_t utf8_byte_mask;
  value_type local_20;
  ulong local_18;
  uint *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  while (local_18 != 0) {
    bVar1 = (byte)*local_10;
    if (bVar1 < 0x80) {
      local_20 = utf16_writer::low(local_20,(uint)bVar1);
      local_10 = (uint *)((long)local_10 + 1);
      local_18 = local_18 - 1;
      if (((ulong)local_10 & 3) == 0) {
        while( true ) {
          bVar3 = false;
          if (3 < local_18) {
            bVar3 = (*local_10 & 0x80808080) == 0;
          }
          if (!bVar3) break;
          puVar2 = utf16_writer::low(local_20,(uint)(byte)*local_10);
          puVar2 = utf16_writer::low(puVar2,(uint)*(byte *)((long)local_10 + 1));
          puVar2 = utf16_writer::low(puVar2,(uint)*(byte *)((long)local_10 + 2));
          local_20 = utf16_writer::low(puVar2,(uint)*(byte *)((long)local_10 + 3));
          local_10 = local_10 + 1;
          local_18 = local_18 - 4;
        }
      }
    }
    else if (((bVar1 - 0xc0 < 0x20) && (1 < local_18)) && ((*local_10 & 0xc000) == 0x8000)) {
      local_20 = utf16_writer::low(local_20,(bVar1 & 0xffffff3f) << 6 |
                                            *(byte *)((long)local_10 + 1) & 0x3f);
      local_10 = (uint *)((long)local_10 + 2);
      local_18 = local_18 - 2;
    }
    else if (((bVar1 - 0xe0 < 0x10) && (2 < local_18)) &&
            (((*local_10 & 0xc000) == 0x8000 && ((*local_10 & 0xc00000) == 0x800000)))) {
      local_20 = utf16_writer::low(local_20,(bVar1 & 0xffffff1f) << 0xc |
                                            (*(byte *)((long)local_10 + 1) & 0x3f) << 6 |
                                            *(byte *)((long)local_10 + 2) & 0x3f);
      local_10 = (uint *)((long)local_10 + 3);
      local_18 = local_18 - 3;
    }
    else if (((bVar1 - 0xf0 < 8) && (3 < local_18)) &&
            (((*local_10 & 0xc000) == 0x8000 &&
             (((*local_10 & 0xc00000) == 0x800000 && ((*local_10 & 0xc0000000) == 0x80000000)))))) {
      local_20 = utf16_writer::high(local_20,(bVar1 & 0xffffff0f) << 0x12 |
                                             (*(byte *)((long)local_10 + 1) & 0x3f) << 0xc |
                                             (*(byte *)((long)local_10 + 2) & 0x3f) << 6 |
                                             *(byte *)((long)local_10 + 3) & 0x3f);
      local_10 = local_10 + 1;
      local_18 = local_18 - 4;
    }
    else {
      local_10 = (uint *)((long)local_10 + 1);
      local_18 = local_18 - 1;
    }
  }
  return local_20;
}

Assistant:

static inline typename Traits::value_type process(const uint8_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			const uint8_t utf8_byte_mask = 0x3f;

			while (size)
			{
				uint8_t lead = *data;

				// 0xxxxxxx -> U+0000..U+007F
				if (lead < 0x80)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;

					// process aligned single-byte (ascii) blocks
					if ((reinterpret_cast<uintptr_t>(data) & 3) == 0)
					{
						// round-trip through void* to silence 'cast increases required alignment of target type' warnings
						while (size >= 4 && (*static_cast<const uint32_t*>(static_cast<const void*>(data)) & 0x80808080) == 0)
						{
							result = Traits::low(result, data[0]);
							result = Traits::low(result, data[1]);
							result = Traits::low(result, data[2]);
							result = Traits::low(result, data[3]);
							data += 4;
							size -= 4;
						}
					}
				}
				// 110xxxxx -> U+0080..U+07FF
				else if (static_cast<unsigned int>(lead - 0xC0) < 0x20 && size >= 2 && (data[1] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xC0) << 6) | (data[1] & utf8_byte_mask));
					data += 2;
					size -= 2;
				}
				// 1110xxxx -> U+0800-U+FFFF
				else if (static_cast<unsigned int>(lead - 0xE0) < 0x10 && size >= 3 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xE0) << 12) | ((data[1] & utf8_byte_mask) << 6) | (data[2] & utf8_byte_mask));
					data += 3;
					size -= 3;
				}
				// 11110xxx -> U+10000..U+10FFFF
				else if (static_cast<unsigned int>(lead - 0xF0) < 0x08 && size >= 4 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80 && (data[3] & 0xc0) == 0x80)
				{
					result = Traits::high(result, ((lead & ~0xF0) << 18) | ((data[1] & utf8_byte_mask) << 12) | ((data[2] & utf8_byte_mask) << 6) | (data[3] & utf8_byte_mask));
					data += 4;
					size -= 4;
				}
				// 10xxxxxx or 11111xxx -> invalid
				else
				{
					data += 1;
					size -= 1;
				}
			}

			return result;
		}